

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::AsyncifyLocals::doWalkFunction(AsyncifyLocals *this,Function *func)

{
  unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
  *puVar1;
  ExpressionList *this_00;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this_01;
  pointer ppBVar2;
  undefined8 *puVar3;
  long *plVar4;
  type tVar5;
  pointer puVar6;
  uintptr_t *puVar7;
  _Hash_node_base *p_Var8;
  Builder BVar9;
  char *pcVar10;
  AsyncifyBuilder *pAVar11;
  uintptr_t uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 *puVar15;
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
  *pWVar16;
  undefined8 uVar17;
  iterator iVar18;
  undefined1 auVar19 [8];
  int iVar20;
  Index IVar21;
  uint uVar22;
  mapped_type *pmVar23;
  size_t sVar24;
  size_type sVar25;
  unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *__s;
  __node_base_ptr p_Var26;
  pointer *ppuVar27;
  pointer *ppuVar28;
  pointer *ppuVar29;
  __node_ptr __node;
  pointer puVar30;
  AsyncifyBuilder *pAVar31;
  Type this_02;
  Expression *pEVar32;
  LocalSet *pLVar33;
  _Base_ptr p_Var34;
  Type *pTVar35;
  Type *pTVar36;
  pointer pLVar37;
  value_type pBVar38;
  TupleMake *value;
  key_type this_03;
  Block *pBVar39;
  Block *pBVar40;
  Store *pSVar41;
  TupleExtract *pTVar42;
  TupleExtract *this_04;
  Type TVar43;
  BasicBlock *this_05;
  _Base_ptr p_Var44;
  Block *pBVar45;
  ulong uVar46;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar47;
  SetOfLocals *__bkt;
  SetOfLocals *live;
  SetOfLocals *extraout_RDX;
  SetOfLocals *live_00;
  _Rb_tree_node_base *p_Var48;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  type *ptVar49;
  pointer *ppuVar50;
  _Link_type __x;
  RelevantLiveLocalsWalker *pRVar51;
  Store *pSVar52;
  MixedArena *pMVar53;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *pAVar54;
  Type in_R8;
  _Rb_tree_node_base *p_Var55;
  pointer __ptr_4;
  Expression **ppEVar56;
  type *ptVar57;
  _Hash_node_base *p_Var58;
  Function *pFVar59;
  pointer ppBVar60;
  ulong uVar61;
  uintptr_t *puVar62;
  _Rb_tree_color index;
  __node_base_ptr p_Var63;
  long lVar64;
  __hash_code _Var65;
  Name *pNVar66;
  type actions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar67;
  AsyncifyLocals *pAVar68;
  __node_base _Var69;
  _Rb_tree_header *p_Var70;
  bool bVar71;
  Signature SVar72;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  optional<wasm::Type> type__02;
  optional<wasm::Type> type__03;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  undefined1 auStack_498 [8];
  SmallVector<wasm::Expression_*,_1UL> loads;
  undefined1 local_440 [152];
  type *local_3a8;
  pointer puStack_3a0;
  pointer local_398;
  pointer pTStack_390;
  pointer local_388;
  BasicBlock *local_380;
  Function *local_378;
  undefined8 uStack_370;
  undefined1 local_368 [40];
  pointer local_340;
  pointer local_330;
  pointer local_328;
  pointer local_318;
  pointer local_310;
  pointer local_300;
  pointer local_2f8;
  pointer local_2e8;
  pointer local_2e0;
  pointer local_2d0;
  pointer local_2c8;
  bool local_2a0;
  _Rb_tree_node_base local_290;
  size_t local_270;
  uint local_268;
  unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *local_260;
  Type *local_258;
  __node_base local_250;
  size_type sStack_248;
  _Prime_rehash_policy local_240;
  undefined1 auStack_230 [16];
  __node_base _Stack_220;
  pointer local_218;
  __node_base_ptr *local_210;
  size_t local_208;
  __node_base local_200;
  size_type sStack_1f8;
  float local_1f0;
  size_t local_1e8;
  __node_base_ptr p_Stack_1e0;
  uint32_t local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d0;
  _Rb_tree_node_base local_1b0;
  size_t local_190;
  unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
  *local_188;
  Block *local_180;
  AsyncifyBuilder *local_178;
  unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
  *local_170;
  Store *local_168;
  Block *local_160;
  Store *local_158;
  Function *local_150;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_148;
  Function *local_140;
  type *local_138;
  iterator __end0;
  undefined1 auStack_128 [8];
  BasicBlock *curr;
  __node_base local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  undefined1 auStack_e8 [8];
  unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
  queue;
  undefined1 local_a0 [8];
  Iterator __begin3;
  _Prime_rehash_policy local_80;
  undefined1 auStack_70 [40];
  pointer *local_48;
  AsyncifyLocals *local_40;
  Name *local_38;
  
  auStack_498 = (undefined1  [8])func;
  __end0._M_current =
       (unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
        *)func;
  pmVar23 = std::
            map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
            ::operator[](&this->analyzer->map,(key_type *)auStack_498);
  if ((pmVar23->canChangeState == true) && ((pmVar23->isTopMostRuntime & 1U) == 0)) {
    local_368._8_8_ = &uStack_370;
    auStack_498 = (undefined1  [8])0x0;
    loads.usedFixed = 0;
    uStack_370 = (Module *)((ulong)uStack_370._4_4_ << 0x20);
    local_368._0_8_ = (_Base_ptr)0x0;
    local_440._88_8_ = (pointer)0x0;
    local_440._96_8_ = (pointer)0x0;
    local_440._104_8_ = (pointer)0x0;
    local_440._112_8_ = (Function *)0x0;
    local_440._120_8_ = (Module *)0x0;
    local_440._128_8_ = (BasicBlock *)0x0;
    local_440._136_8_ = (BasicBlock *)0x0;
    local_440._144_8_ = (type *)0x0;
    local_3a8 = (type *)0x0;
    puStack_3a0 = (pointer)0x0;
    local_398 = (pointer)0x0;
    pTStack_390 = (pointer)0x0;
    local_388 = (pointer)0x0;
    local_290._M_color = _S_red;
    local_290._M_parent = (_Base_ptr)0x0;
    local_368._16_8_ = local_368._8_8_;
    local_40 = this;
    memset(local_368 + 0x18,0,0xb2);
    local_270 = 0;
    local_260 = (unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 *)auStack_230;
    local_258 = (Type *)0x1;
    local_250._M_nxt = (_Hash_node_base *)0x0;
    sStack_248 = 0;
    local_240._M_max_load_factor = 1.0;
    local_210 = &p_Stack_1e0;
    local_240._M_next_resize = 0;
    auStack_230._0_8_ = (__node_base_ptr)0x0;
    auStack_230._8_8_ = (pointer)0x0;
    _Stack_220._M_nxt = (_Hash_node_base *)0x0;
    local_218 = (pointer)0x0;
    local_208 = 1;
    local_200._M_nxt = (__node_base_ptr)0x0;
    sStack_1f8 = 0;
    local_1f0 = 1.0;
    local_1e8 = 0;
    p_Stack_1e0 = (__node_base_ptr)0x0;
    local_1d8 = 0;
    local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b0._M_left = &local_1b0;
    local_1b0._M_color = _S_red;
    local_1b0._M_parent = (_Rb_tree_node_base *)0x0;
    local_190 = 0;
    local_440._120_8_ =
         (local_40->
         super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
         ).
         super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
         .currModule;
    local_440._112_8_ = __end0._M_current;
    local_290._M_left = &local_290;
    local_290._M_right = &local_290;
    local_1b0._M_right = local_1b0._M_left;
    sVar24 = Function::getNumLocals((Function *)__end0._M_current);
    local_268 = (uint)sVar24;
    sparse_square_matrix<unsigned_char>::recreate
              ((sparse_square_matrix<unsigned_char> *)(auStack_230 + 8),local_268);
    if (local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    __x = (_Link_type)(ulong)local_268;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_1d0,(size_type)__x);
    ptVar57 = local_3a8;
    uVar17 = local_440._144_8_;
    ptVar49 = (type *)local_440._144_8_;
    if (local_3a8 != (type *)local_440._144_8_) {
      do {
        std::
        unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
        ::~unique_ptr((unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
                       *)&ptVar49->__align);
        ptVar49 = ptVar49 + 1;
      } while (ptVar49 != ptVar57);
      local_3a8 = (type *)uVar17;
    }
    std::
    _Rb_tree<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
    ::_M_erase((_Rb_tree<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
                *)local_290._M_parent,__x);
    local_290._M_parent = (_Base_ptr)0x0;
    local_270 = 0;
    local_440._136_8_ = (BasicBlock *)0x0;
    local_2a0 = false;
    local_290._M_left = &local_290;
    local_290._M_right = &local_290;
    CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    ::startBasicBlock((CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                       *)auStack_498);
    local_440._128_8_ = local_380;
    if (((long)(local_440._96_8_ - local_440._88_8_) >> 4) + loads.usedFixed != 0) {
      __assert_fail("stack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                    ,0x12d,
                    "void wasm::Walker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::walk(Expression *&) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                   );
    }
    local_170 = __end0._M_current + 0xc;
    Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::pushTask
              ((Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_> *)
               auStack_498,
               CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
               ::scan,(Expression **)local_170);
    pRVar51 = (RelevantLiveLocalsWalker *)
              (((long)(local_440._96_8_ - local_440._88_8_) >> 4) + loads.usedFixed);
    while (pRVar51 != (RelevantLiveLocalsWalker *)0x0) {
      if (local_440._88_8_ == local_440._96_8_) {
        if (loads.usedFixed == 0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::Task, 10>::back() [T = wasm::Walker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::Task, N = 10]"
                       );
        }
        pEVar32 = (&loads.fixed)[loads.usedFixed * 2 + -2]._M_elems[0];
        auStack_498 = (undefined1  [8])(&loads.fixed)[loads.usedFixed * 2 + -1]._M_elems[0];
        loads.usedFixed = loads.usedFixed - 1;
      }
      else {
        pEVar32 = (Expression *)((pointer)(local_440._96_8_ + 0xfffffffffffffff0))->func;
        auStack_498 = (undefined1  [8])((pointer)(local_440._96_8_ + 0xfffffffffffffff0))->currp;
        local_440._96_8_ = (pointer)(local_440._96_8_ + 0xfffffffffffffff0);
      }
      if (*(long *)&(((key_type)auStack_498)->super_Importable).super_Named.name.super_IString == 0)
      {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::walk(Expression *&) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                     );
      }
      (*(code *)pEVar32)((CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                          *)auStack_498);
      pRVar51 = (RelevantLiveLocalsWalker *)
                (((long)(local_440._96_8_ - local_440._88_8_) >> 4) + loads.usedFixed);
    }
    if (local_380 != (BasicBlock *)0x0) {
      CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
      ::doEndReturn((CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                     *)auStack_498,(RelevantLiveLocalsWalker *)0x0,(Expression **)local_440._88_8_);
    }
    if (local_2a0 == true) {
      auStack_e8 = (undefined1  [8])local_440._136_8_;
      std::
      vector<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
      ::push_back((vector<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                   *)(local_440 + 0x90),(value_type *)auStack_e8);
      std::
      unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
      ::~unique_ptr((unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
                     *)auStack_e8);
    }
    if (local_368._24_8_ != 0) {
      __assert_fail("branches.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x255,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if (local_340 != (pointer)local_368._32_8_) {
      __assert_fail("ifLastBlockStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x256,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if (local_328 != local_330) {
      __assert_fail("loopLastBlockStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,599,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if (local_310 != local_318) {
      __assert_fail("tryLastBlockStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,600,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if (local_2f8 != local_300) {
      __assert_fail("throwingInstsStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x259,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if (local_2e0 != local_2e8) {
      __assert_fail("tryStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x25a,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if (local_2c8 != local_2d0) {
      __assert_fail("processCatchStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x25b,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    local_a0 = (undefined1  [8])auStack_70;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x1;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    auStack_70._0_8_ = (__node_base_ptr)0x0;
    auStack_e8 = (undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize;
    queue._M_h._M_buckets = (__buckets_ptr)0x1;
    queue._M_h._M_bucket_count = 0;
    queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    queue._M_h._M_element_count._0_4_ = 0x3f800000;
    queue._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    queue._M_h._M_rehash_policy._4_4_ = 0;
    queue._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::insert((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
              *)auStack_e8,(value_type *)(local_440 + 0x80));
    puVar15 = (undefined8 *)queue._M_h._M_bucket_count;
    if (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      do {
        pBVar38 = *(value_type *)(queue._M_h._M_bucket_count + 8);
        auStack_128 = (undefined1  [8])pBVar38;
        std::
        unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ::erase((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 *)auStack_e8,(iterator)queue._M_h._M_bucket_count);
        std::
        unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ::insert((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  *)local_a0,(value_type *)auStack_128);
        ppBVar2 = (pBVar38->out).
                  super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppBVar60 = (pBVar38->out).
                        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppBVar60 != ppBVar2;
            ppBVar60 = ppBVar60 + 1) {
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*ppBVar60;
          sVar25 = std::
                   unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)local_a0,
                           (key_type *)
                           __begin3.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent);
          if (sVar25 == 0) {
            std::
            unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
            ::insert((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                      *)auStack_e8,(value_type *)&local_108);
          }
        }
        puVar15 = (undefined8 *)queue._M_h._M_bucket_count;
      } while (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0);
    }
    while (puVar15 != (undefined8 *)0x0) {
      puVar3 = (undefined8 *)*puVar15;
      operator_delete(puVar15,0x10);
      puVar15 = puVar3;
    }
    memset((void *)auStack_e8,0,(long)queue._M_h._M_buckets << 3);
    queue._M_h._M_bucket_count = 0;
    queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    __s = (unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
           *)auStack_70;
    _Var69._M_nxt = local_250._M_nxt;
    if ((undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize != auStack_e8) {
      operator_delete((void *)auStack_e8,(long)queue._M_h._M_buckets << 3);
      _Var69._M_nxt = local_250._M_nxt;
    }
    while (_Var69._M_nxt != (_Hash_node_base *)0x0) {
      p_Var58 = (_Var69._M_nxt)->_M_nxt;
      operator_delete(_Var69._M_nxt,0x10);
      _Var69._M_nxt = p_Var58;
    }
    if ((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
         *)auStack_230 != local_260) {
      operator_delete(local_260,(long)local_258 << 3);
    }
    pTVar35 = __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    local_240._M_max_load_factor = 1.0;
    local_240._4_4_ = local_80._4_4_;
    local_240._M_next_resize = 0;
    local_260 = (unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 *)local_a0;
    if ((undefined1  [8])__s == local_a0) {
      auStack_230._0_8_ = auStack_70._0_8_;
      local_260 = (unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   *)auStack_230;
    }
    local_258 = __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    local_250._M_nxt =
         (_Hash_node_base *)
         __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    sStack_248 = 0;
    if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 0) {
      (&(local_260->_M_h)._M_buckets)
      [*(ulong *)(__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                 + 8) %
       (ulong)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent] =
           &local_250._M_nxt;
    }
    local_a0 = (undefined1  [8])0x0;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    auStack_70._0_8_ = (__node_base_ptr)0x0;
    if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
        (Type *)0x1) {
      __s = (unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
             *)__gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                         ((new_allocator<std::__detail::_Hash_node_base_*> *)auStack_e8,
                          (size_type)
                          __begin3.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                          ,(void *)0x0);
      memset(__s,0,(long)pTVar35 << 3);
    }
    _Var69._M_nxt = local_250._M_nxt;
    local_a0 = (undefined1  [8])__s;
    if (local_250._M_nxt != (_Hash_node_base *)0x0) {
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)operator_new(0x10);
      ((__node_base_ptr)
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index)->_M_nxt =
           (_Hash_node_base *)0x0;
      p_Var58 = _Var69._M_nxt[1]._M_nxt;
      ((__node_base_ptr)
      (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 8))->
      _M_nxt = p_Var58;
      (&((_Hashtable *)local_a0)->_M_buckets)
      [(ulong)p_Var58 %
       (ulong)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent] =
           (__buckets_ptr)
           &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
      p_Var63 = (__node_base_ptr)
                __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
      for (p_Var58 = (_Var69._M_nxt)->_M_nxt; p_Var58 != (_Hash_node_base *)0x0;
          p_Var58 = p_Var58->_M_nxt) {
        p_Var26 = (__node_base_ptr)operator_new(0x10);
        p_Var26->_M_nxt = (_Hash_node_base *)0x0;
        p_Var26[1]._M_nxt = p_Var58[1]._M_nxt;
        p_Var63->_M_nxt = p_Var26;
        uVar46 = (ulong)p_Var26[1]._M_nxt %
                 (ulong)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .parent;
        if ((&((_Hashtable *)local_a0)->_M_buckets)[uVar46] == (__buckets_ptr)0x0) {
          (&((_Hashtable *)local_a0)->_M_buckets)[uVar46] = &p_Var63->_M_nxt;
        }
        p_Var63 = p_Var26;
      }
    }
    local_138 = local_3a8;
    ptVar57 = (type *)local_440._144_8_;
    puVar15 = (undefined8 *)
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    if ((type *)local_440._144_8_ != local_3a8) {
      do {
        pTVar35 = __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  parent;
        auVar19 = local_a0;
        _Var65 = *(__hash_code *)ptVar57->__data;
        sVar25 = std::
                 unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                          *)local_a0,
                         (key_type *)
                         __begin3.
                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent)
        ;
        ppuVar27 = *(pointer **)(_Var65 + 0x60);
        ppuVar50 = *(pointer **)(_Var65 + 0x68);
        if (sVar25 == 0) {
          if (ppuVar50 != ppuVar27) {
            *(pointer **)(_Var65 + 0x68) = ppuVar27;
            _Var65 = *(__hash_code *)ptVar57->__data;
          }
          if (*(long *)(_Var65 + 0x50) != *(long *)(_Var65 + 0x48)) {
            *(long *)(_Var65 + 0x50) = *(long *)(_Var65 + 0x48);
          }
        }
        else {
          uVar46 = (long)ppuVar50 - (long)ppuVar27;
          ppuVar28 = ppuVar27;
          auStack_70._8_8_ = ptVar57;
          auStack_70._32_8_ = uVar46;
          local_38 = (Name *)_Var65;
          if (0 < (long)uVar46 >> 5) {
            local_48 = (pointer *)((long)ppuVar27 + (uVar46 & 0xffffffffffffffe0));
            lVar64 = ((long)uVar46 >> 5) + 1;
            ppuVar28 = ppuVar27 + 2;
            do {
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)auVar19,(key_type *)pTVar35);
              if (sVar25 == 0) {
                ppuVar28 = ppuVar28 + 0xfffffffffffffffe;
                pNVar66 = local_38;
                goto LAB_007ba633;
              }
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)auVar19,(key_type *)pTVar35);
              if (sVar25 == 0) {
                ppuVar28 = ppuVar28 + 0xffffffffffffffff;
                pNVar66 = local_38;
                goto LAB_007ba633;
              }
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)auVar19,(key_type *)pTVar35);
              pNVar66 = local_38;
              if (sVar25 == 0) goto LAB_007ba633;
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)auVar19,(key_type *)pTVar35);
              if (sVar25 == 0) {
                ppuVar28 = ppuVar28 + 1;
                pNVar66 = local_38;
                goto LAB_007ba633;
              }
              lVar64 = lVar64 + -1;
              ppuVar28 = ppuVar28 + 4;
            } while (1 < lVar64);
            uVar46 = (long)ppuVar50 - (long)local_48;
            ppuVar28 = local_48;
          }
          pNVar66 = local_38;
          lVar64 = (long)uVar46 >> 3;
          if (lVar64 == 1) {
LAB_007ba611:
            sVar25 = std::
                     unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                              *)auVar19,(key_type *)pTVar35);
            if (sVar25 != 0) {
              ppuVar28 = ppuVar50;
            }
LAB_007ba633:
            uVar46 = auStack_70._32_8_;
            if ((ppuVar28 != ppuVar50) && (ppuVar29 = ppuVar28 + 1, ppuVar29 != ppuVar50)) {
              do {
                pEVar32 = (Expression *)*ppuVar29;
                sVar25 = std::
                         unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                         ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                  *)local_a0,(key_type *)pTVar35);
                if (sVar25 != 0) {
                  *ppuVar28 = (pointer)pEVar32;
                  ppuVar28 = ppuVar28 + 1;
                }
                ppuVar29 = ppuVar29 + 1;
              } while (ppuVar29 != ppuVar50);
              ppuVar50 = *(pointer **)((long)*(type *)auStack_70._8_8_ + 0x68);
              ppuVar27 = *(pointer **)((long)local_38 + 0x60);
              uVar46 = (long)ppuVar50 - (long)ppuVar27;
              pNVar66 = local_38;
            }
            if (ppuVar28 != ppuVar50) {
              ppuVar27 = (pointer *)((long)ppuVar27 + uVar46);
              ppuVar29 = ppuVar50;
              if (*(Expression ***)((long)pNVar66 + 0x68) != (Expression **)ppuVar50) {
                memmove(ppuVar28,ppuVar27,
                        (long)*(Expression ***)((long)pNVar66 + 0x68) - (long)ppuVar50);
                ppuVar27 = *(pointer **)((long)pNVar66 + 0x68);
                ppuVar29 = ppuVar27;
              }
              ppEVar56 = (Expression **)((long)ppuVar28 + ((long)ppuVar29 - (long)ppuVar50));
              if ((Expression **)ppuVar27 != ppEVar56) {
                *(Expression ***)((long)pNVar66 + 0x68) = ppEVar56;
              }
            }
          }
          else {
            if (lVar64 == 2) {
LAB_007ba5be:
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)auVar19,(key_type *)pTVar35);
              if (sVar25 != 0) {
                ppuVar28 = ppuVar28 + 1;
                goto LAB_007ba611;
              }
              goto LAB_007ba633;
            }
            if (lVar64 == 3) {
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)auVar19,(key_type *)pTVar35);
              if (sVar25 != 0) {
                ppuVar28 = ppuVar28 + 1;
                goto LAB_007ba5be;
              }
              goto LAB_007ba633;
            }
          }
          pTVar35 = __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    parent;
          auVar19 = local_a0;
          local_38 = *(Name **)auStack_70._8_8_;
          ppuVar28 = *(pointer **)((long)local_38 + 0x48);
          ppuVar27 = *(pointer **)((long)local_38 + 0x50);
          pvVar47 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    ((long)ppuVar27 - (long)ppuVar28);
          ppuVar50 = ppuVar28;
          auStack_70._32_8_ = pvVar47;
          if (0 < (long)pvVar47 >> 5) {
            local_48 = (pointer *)((long)ppuVar28 + ((ulong)pvVar47 & 0xffffffffffffffe0));
            lVar64 = ((long)pvVar47 >> 5) + 1;
            ppuVar50 = ppuVar28 + 2;
            do {
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)auVar19,(key_type *)pTVar35);
              if (sVar25 == 0) {
                ppuVar50 = ppuVar50 + 0xfffffffffffffffe;
                goto LAB_007ba84f;
              }
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)auVar19,(key_type *)pTVar35);
              if (sVar25 == 0) {
                ppuVar50 = ppuVar50 + 0xffffffffffffffff;
                goto LAB_007ba84f;
              }
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)auVar19,(key_type *)pTVar35);
              if (sVar25 == 0) goto LAB_007ba84f;
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)auVar19,(key_type *)pTVar35);
              if (sVar25 == 0) {
                ppuVar50 = ppuVar50 + 1;
                goto LAB_007ba84f;
              }
              lVar64 = lVar64 + -1;
              ppuVar50 = ppuVar50 + 4;
            } while (1 < lVar64);
            pvVar47 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      ((long)ppuVar27 - (long)local_48);
            ppuVar50 = local_48;
          }
          pTVar35 = __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    parent;
          auVar19 = local_a0;
          lVar64 = (long)pvVar47 >> 3;
          if (lVar64 == 3) {
            sVar25 = std::
                     unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                              *)local_a0,
                             (key_type *)
                             __begin3.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent);
            if (sVar25 != 0) {
              ppuVar50 = ppuVar50 + 1;
              goto LAB_007ba811;
            }
          }
          else {
            if (lVar64 == 2) {
LAB_007ba811:
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)auVar19,(key_type *)pTVar35);
              if (sVar25 == 0) goto LAB_007ba84f;
              ppuVar50 = ppuVar50 + 1;
            }
            else {
              ptVar57 = (type *)auStack_70._8_8_;
              if (lVar64 != 1) goto LAB_007ba8f4;
            }
            sVar25 = std::
                     unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                              *)auVar19,(key_type *)pTVar35);
            if (sVar25 != 0) {
              ppuVar50 = ppuVar27;
            }
          }
LAB_007ba84f:
          pvVar47 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_70._32_8_;
          if ((ppuVar50 != ppuVar27) && (ppuVar29 = ppuVar50 + 1, ppuVar29 != ppuVar27)) {
            do {
              pEVar32 = (Expression *)*ppuVar29;
              sVar25 = std::
                       unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ::count((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)local_a0,(key_type *)pTVar35);
              if (sVar25 != 0) {
                *ppuVar50 = (pointer)pEVar32;
                ppuVar50 = ppuVar50 + 1;
              }
              ppuVar29 = ppuVar29 + 1;
            } while (ppuVar29 != ppuVar27);
            ppuVar27 = *(pointer **)((long)*(type *)auStack_70._8_8_ + 0x50);
            ppuVar28 = *(pointer **)((long)local_38 + 0x48);
            pvVar47 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      ((long)ppuVar27 - (long)ppuVar28);
          }
          pNVar66 = local_38;
          ptVar57 = (type *)auStack_70._8_8_;
          if (ppuVar50 != ppuVar27) {
            ppuVar28 = (pointer *)
                       ((long)ppuVar28 +
                       (long)&(pvVar47->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start);
            ppuVar29 = ppuVar27;
            if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)((long)local_38 + 0x50) !=
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar27) {
              memmove(ppuVar50,ppuVar28,
                      (long)*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                             ((long)local_38 + 0x50) - (long)ppuVar27);
              ppuVar28 = *(pointer **)((long)pNVar66 + 0x50);
              ppuVar29 = ppuVar28;
            }
            pvVar47 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      ((long)ppuVar50 + ((long)ppuVar29 - (long)ppuVar27));
            if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar28 != pvVar47) {
              *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)((long)pNVar66 + 0x50) =
                   pvVar47;
            }
          }
        }
LAB_007ba8f4:
        ptVar57 = ptVar57 + 1;
        puVar15 = (undefined8 *)
                  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
        ;
      } while (ptVar57 != local_138);
    }
    while (puVar15 != (undefined8 *)0x0) {
      puVar3 = (undefined8 *)*puVar15;
      operator_delete(puVar15,0x10);
      puVar15 = puVar3;
    }
    memset((void *)local_a0,0,
           (long)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
           << 3);
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    if ((undefined1  [8])auStack_70 != local_a0) {
      operator_delete((void *)local_a0,
                      (long)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent << 3);
    }
    ptVar57 = local_3a8;
    auStack_e8 = (undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize;
    queue._M_h._M_buckets = (__buckets_ptr)0x1;
    queue._M_h._M_bucket_count = 0;
    queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    queue._M_h._M_element_count._0_4_ = 0x3f800000;
    queue._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    queue._M_h._M_rehash_policy._4_4_ = 0;
    queue._M_h._M_rehash_policy._M_next_resize = 0;
    ptVar49 = (type *)local_440._144_8_;
    puVar15 = (undefined8 *)queue._M_h._M_bucket_count;
    if ((type *)local_440._144_8_ != local_3a8) {
      do {
        actions = *(type *)ptVar49->__data;
        sVar25 = std::
                 unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ::count(local_260,(key_type *)local_258);
        if (sVar25 != 0) {
          __bkt = (SetOfLocals *)((ulong)actions % (ulong)queue._M_h._M_buckets);
          plVar4 = *(long **)((long)&(((Liveness *)auStack_e8)->start).
                                     super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + (long)__bkt * 8);
          if (plVar4 != (long *)0x0) {
            plVar4 = (long *)*plVar4;
            tVar5 = *(type *)(plVar4 + 1);
            live = __bkt;
            do {
              if (tVar5 == actions) goto LAB_007baa56;
              plVar4 = (long *)*plVar4;
              if (plVar4 == (long *)0x0) break;
              tVar5 = *(type *)((type *)(plVar4 + 1))->__data;
              live = (SetOfLocals *)((ulong)tVar5 % (ulong)queue._M_h._M_buckets);
            } while (live == __bkt);
          }
          __node = (__node_ptr)operator_new(0x10);
          (__node->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
          (__node->
          super__Hash_node_value<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ).
          super__Hash_node_value_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>
          ._M_storage._M_storage = actions;
          std::
          _Hashtable<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_insert_unique_node
                    ((_Hashtable<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)auStack_e8,(size_type)__bkt,(__hash_code)actions,__node,in_R8.id);
          actions = *ptVar49;
          live = extraout_RDX;
LAB_007baa56:
          LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::
          scanLivenessThroughActions
                    ((LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      *)((long)actions + 0x30),
                     (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)actions,
                     live);
        }
        ptVar49 = ptVar49 + 1;
      } while (ptVar49 != ptVar57);
      puVar15 = (undefined8 *)queue._M_h._M_bucket_count;
      if (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        do {
          pvVar47 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                     (queue._M_h._M_bucket_count + 8);
          std::
          unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
          ::erase((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   *)auStack_e8,(iterator)queue._M_h._M_bucket_count);
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          puVar30 = pvVar47[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (pvVar47[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar30) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (&local_108,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)puVar30);
            puVar30 = pvVar47[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (8 < (ulong)((long)pvVar47[3].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar30)) {
              uVar46 = 1;
              uVar61 = 2;
              do {
                SortedVector::merge((SortedVector *)auStack_128,(SortedVector *)&local_108,
                                    *(SortedVector **)(puVar30 + uVar46 * 2));
                puVar6 = local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                puVar30 = local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)auStack_128;
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)curr;
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)local_118._M_nxt;
                auStack_128 = (undefined1  [8])0x0;
                curr = (BasicBlock *)0x0;
                local_118._M_nxt = (_Hash_node_base *)0x0;
                if (((value_type)puVar30 != (value_type)0x0) &&
                   (operator_delete(puVar30,(long)puVar6 - (long)puVar30),
                   auStack_128 != (undefined1  [8])0x0)) {
                  operator_delete((void *)auStack_128,(long)local_118._M_nxt - (long)auStack_128);
                }
                puVar30 = pvVar47[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar71 = uVar61 < (ulong)((long)pvVar47[3].
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)puVar30 >> 3);
                uVar46 = uVar61;
                uVar61 = (ulong)((int)uVar61 + 1);
              } while (bVar71);
            }
            puVar30 = pvVar47[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar6 = pvVar47[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            uVar61 = (long)puVar6 - (long)puVar30;
            uVar46 = (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if ((uVar61 != uVar46) ||
               ((puVar6 != puVar30 &&
                (iVar20 = bcmp(puVar30,local_108.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start,uVar61),
                iVar20 != 0)))) {
              if (uVar46 <= uVar61) {
                __assert_fail("curr->contents.end.size() < live.size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/liveness-traversal.h"
                              ,0xf4,
                              "void wasm::LivenessWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::flowLiveness() [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                             );
              }
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (pvVar47 + 1,&local_108);
              LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              ::scanLivenessThroughActions
                        ((LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                          *)(pvVar47 + 2),
                         (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                         &local_108,live_00);
              puVar30 = (pvVar47->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              puVar6 = (pvVar47->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              uVar61 = (long)puVar6 - (long)puVar30;
              uVar46 = (long)local_108.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_108.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
              if ((uVar61 != uVar46) ||
                 ((puVar6 != puVar30 &&
                  (iVar20 = bcmp(puVar30,local_108.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start,uVar61),
                  iVar20 != 0)))) {
                if (uVar46 <= uVar61) {
                  __assert_fail("curr->contents.start.size() < live.size()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/liveness-traversal.h"
                                ,0xfc,
                                "void wasm::LivenessWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::flowLiveness() [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                               );
                }
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                          (pvVar47,&local_108);
                puVar7 = (uintptr_t *)
                         pvVar47[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                for (puVar62 = (uintptr_t *)
                               pvVar47[4].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start; puVar62 != puVar7;
                    puVar62 = puVar62 + 1) {
                  auStack_128 = (undefined1  [8])*puVar62;
                  std::
                  unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  ::insert((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auStack_e8,(value_type *)auStack_128);
                }
              }
            }
          }
          if ((value_type)
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (value_type)0x0) {
            operator_delete(local_108.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_108.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_108.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          puVar15 = (undefined8 *)queue._M_h._M_bucket_count;
        } while (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0);
      }
    }
    while (puVar15 != (undefined8 *)0x0) {
      puVar3 = (undefined8 *)*puVar15;
      operator_delete(puVar15,0x10);
      puVar15 = puVar3;
    }
    memset((void *)auStack_e8,0,(long)queue._M_h._M_buckets << 3);
    queue._M_h._M_bucket_count = 0;
    queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize != auStack_e8) {
      operator_delete((void *)auStack_e8,(long)queue._M_h._M_buckets << 3);
    }
    local_440._112_8_ = (Function *)0x0;
    local_440._120_8_ = (Module *)0x0;
    if (local_250._M_nxt != (_Hash_node_base *)0x0) {
      this_01 = &local_40->relevantLiveLocals;
      _Var69._M_nxt = local_250._M_nxt;
      do {
        if (local_1b0._M_parent != (_Rb_tree_node_base *)0x0) {
          p_Var58 = _Var69._M_nxt[1]._M_nxt;
          p_Var34 = local_1b0._M_parent;
          in_R8.id = (uintptr_t)&local_1b0;
          do {
            p_Var55 = (_Rb_tree_node_base *)in_R8.id;
            p_Var48 = p_Var34;
            p_Var8 = *(_Hash_node_base **)(p_Var48 + 1);
            in_R8.id = (uintptr_t)p_Var48;
            if (p_Var8 < p_Var58) {
              in_R8.id = (uintptr_t)p_Var55;
            }
            p_Var34 = (&p_Var48->_M_left)[p_Var8 < p_Var58];
          } while ((&p_Var48->_M_left)[p_Var8 < p_Var58] != (_Base_ptr)0x0);
          if ((_Rb_tree_node_base *)in_R8.id != &local_1b0) {
            if (p_Var8 < p_Var58) {
              p_Var48 = p_Var55;
            }
            if (*(_Hash_node_base **)(p_Var48 + 1) <= p_Var58) {
              p_Var8 = p_Var58[1]._M_nxt;
              for (p_Var58 = p_Var58->_M_nxt; p_Var58 != p_Var8;
                  p_Var58 = (_Hash_node_base *)((long)&p_Var58->_M_nxt + 4)) {
                auStack_e8._0_4_ = *(undefined4 *)&p_Var58->_M_nxt;
                std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)this_01,(uint *)auStack_e8);
              }
            }
          }
        }
        _Var69._M_nxt = (_Var69._M_nxt)->_M_nxt;
      } while (_Var69._M_nxt != (_Hash_node_base *)0x0);
    }
    ::anon_func::RelevantLiveLocalsWalker::~RelevantLiveLocalsWalker
              ((RelevantLiveLocalsWalker *)auStack_498);
    iVar18 = __end0;
    queue._M_h._M_single_bucket._4_4_ =
         Builder::addVar((Builder *)__end0._M_current,(Function *)0x0,(Name)(ZEXT816(2) << 0x40),
                         in_R8);
    IVar21 = Builder::addVar((Builder *)iVar18._M_current,(Function *)0x0,(Name)(ZEXT816(2) << 0x40)
                             ,in_R8);
    pAVar68 = local_40;
    local_40->rewindIndex = IVar21;
    pWVar16 = &local_40->
               super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
    ;
    BVar9.wasm = (local_40->
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                 ).
                 super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                 .currModule;
    pcVar10 = (local_40->asyncifyMemory).super_IString.str._M_str;
    pAVar31 = (AsyncifyBuilder *)operator_new(0x28);
    (pAVar31->super_Builder).wasm = BVar9.wasm;
    pAVar31->wasm = BVar9.wasm;
    sVar24 = (pAVar68->asyncifyMemory).super_IString.str._M_len;
    (pAVar31->pointerType).id = (pAVar68->pointerType).id;
    (pAVar31->asyncifyMemory).super_IString.str._M_len = sVar24;
    *(char **)((long)&(pAVar31->asyncifyMemory).super_IString + 8) = pcVar10;
    pAVar11 = (pAVar68->builder)._M_t.
              super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
              _M_head_impl;
    (pAVar68->builder)._M_t.
    super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>._M_head_impl =
         pAVar31;
    if (pAVar11 != (AsyncifyBuilder *)0x0) {
      operator_delete(pAVar11,0x28);
    }
    Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
    ::walk(&(pWVar16->
            super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
            ).
            super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
           ,(Expression **)local_170);
    puVar1 = __end0._M_current + 7;
    SVar72 = HeapType::getSignature((HeapType *)puVar1);
    pMVar53 = &((((pAVar68->builder)._M_t.
                  super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                  .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
                 _M_head_impl)->super_Builder).wasm)->allocator;
    if (SVar72.results.id.id == 0) {
      local_140 = (Function *)MixedArena::allocSpace(pMVar53,0x18,8);
      *(undefined1 *)&(local_140->super_Importable).super_Named.name.super_IString.str._M_len = 0x13
      ;
      (local_140->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x1;
      *(undefined8 *)&(local_140->super_Importable).super_Named.hasExplicitName = 0;
    }
    else {
      local_140 = (Function *)MixedArena::allocSpace(pMVar53,0x10,8);
      *(undefined1 *)&(local_140->super_Importable).super_Named.name.super_IString.str._M_len = 0x17
      ;
      (local_140->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x1;
    }
    local_38 = &pAVar68->asyncifyMemory;
    local_178 = (pAVar68->builder)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
                _M_head_impl;
    local_168 = (Store *)AsyncifyBuilder::makeStateCheck(local_178,Rewinding);
    local_188 = puVar1;
    if ((pAVar68->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      pBVar39 = (Block *)MixedArena::allocSpace
                                   (&((((pAVar68->builder)._M_t.
                                        super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                        .
                                        super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                                       ._M_head_impl)->super_Builder).wasm)->allocator,0x10,8);
      (pBVar39->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = NopId;
      (pBVar39->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    }
    else {
      pFVar59 = (pAVar68->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                .currFunction;
      pvVar47 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                Function::getNumLocals(pFVar59);
      local_48 = (pointer *)pvVar47;
      if (pvVar47 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        iVar20 = 0;
      }
      else {
        p_Var70 = &(pAVar68->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header;
        iVar20 = 0;
        TVar43.id = 0;
        do {
          p_Var34 = (local_40->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          index = (_Rb_tree_color)TVar43.id;
          p_Var44 = &p_Var70->_M_header;
          if (p_Var34 != (_Base_ptr)0x0) {
            do {
              bVar71 = p_Var34[1]._M_color < index;
              if (!bVar71) {
                p_Var44 = p_Var34;
              }
              p_Var34 = (&p_Var34->_M_left)[bVar71];
            } while (p_Var34 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var44 != p_Var70) && (p_Var44[1]._M_color <= index)) {
              this_02 = Function::getLocalType(pFVar59,index);
              uVar22 = getByteSize((AsyncifyLocals *)this_02.id,TVar43);
              iVar20 = iVar20 + uVar22;
              pvVar47 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48;
            }
          }
          TVar43.id = (uintptr_t)(index + _S_black);
        } while (TVar43.id < pvVar47);
      }
      pAVar68 = local_40;
      pMVar53 = &((((local_40->builder)._M_t.
                    super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                    .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
                   _M_head_impl)->super_Builder).wasm)->allocator;
      local_160 = (Block *)MixedArena::allocSpace(pMVar53,0x40,8);
      (local_160->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (local_160->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (local_160->name).super_IString.str._M_len = 0;
      (local_160->name).super_IString.str._M_str = (char *)0x0;
      (local_160->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (local_160->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (local_160->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (local_160->list).allocator = pMVar53;
      this_00 = &local_160->list;
      pEVar32 = AsyncifyBuilder::makeIncStackPos
                          ((pAVar68->builder)._M_t.
                           super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                           .
                           super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                           ._M_head_impl,-iVar20);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_00->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar32
                );
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           (((pAVar68->builder)._M_t.
             super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
            _M_head_impl)->pointerType).id;
      IVar21 = Builder::addVar((Builder *)pFVar59,(Function *)0x0,(Name)(auVar13 << 0x40),in_R8);
      pAVar11 = (pAVar68->builder)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
                _M_head_impl;
      pEVar32 = AsyncifyBuilder::makeGetStackPos(pAVar11);
      local_138 = (type *)CONCAT44(local_138._4_4_,IVar21);
      pLVar33 = Builder::makeLocalSet(&pAVar11->super_Builder,IVar21,pEVar32);
      local_158 = (Store *)this_00;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_00->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pLVar33);
      pvVar47 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48;
      if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        pAVar54 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                  &(pAVar68->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header;
        auStack_70._8_8_ = auStack_70._8_8_ & 0xffffffff00000000;
        pvVar67 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_150 = pFVar59;
        local_148 = pAVar54;
        do {
          p_Var34 = (pAVar68->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          p_Var44 = (_Base_ptr)pAVar54;
          if (p_Var34 != (_Base_ptr)0x0) {
            do {
              uVar22 = (uint)pvVar67;
              bVar71 = (uint)*(size_t *)(p_Var34 + 1) < uVar22;
              if (!bVar71) {
                p_Var44 = p_Var34;
              }
              p_Var34 = (&p_Var34->_M_left)[bVar71];
            } while (p_Var34 != (_Base_ptr)0x0);
            if ((p_Var44 != (_Base_ptr)pAVar54) &&
               ((uint)((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                      ((long)p_Var44 + 0x18))->usedElements <= uVar22)) {
              TVar43.id = (uintptr_t)pvVar67;
              auStack_128 = (undefined1  [8])Function::getLocalType(pFVar59,uVar22);
              auStack_498 = (undefined1  [8])0x0;
              loads.flexible.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              loads.fixed._M_elems[0] = (_Type)(Expression *)0x0;
              loads.flexible.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)0x0;
              local_a0 = (undefined1  [8])auStack_128;
              pTVar35 = (Type *)wasm::Type::size((Type *)auStack_128);
              auStack_70._32_8_ = pvVar67;
              if ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   parent != pTVar35) || (local_a0 != (undefined1  [8])auStack_128)) {
                do {
                  pTVar36 = wasm::Type::Iterator::operator*((Iterator *)local_a0);
                  uVar22 = getByteSize((AsyncifyLocals *)pTVar36->id,TVar43);
                  if ((uVar22 & 3) != 0) {
                    __assert_fail("size % STACK_ALIGN == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp"
                                  ,0x5e9,
                                  "Expression *wasm::(anonymous namespace)::AsyncifyLocals::makeLocalLoading()"
                                 );
                  }
                  pAVar11 = (pAVar68->builder)._M_t.
                            super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                            .
                            super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                            ._M_head_impl;
                  uVar12 = (pAVar11->pointerType).id;
                  pLVar37 = (pointer)MixedArena::allocSpace
                                               (&((pAVar11->super_Builder).wasm)->allocator,0x18,8);
                  *(Id *)&pLVar37->what = LocalGetId;
                  *(undefined4 *)&pLVar37->effective = local_138._0_4_;
                  ((Type *)&pLVar37->origin)->id = uVar12;
                  uVar12 = pTVar36->id;
                  auStack_e8 = (undefined1  [8])(local_38->super_IString).str._M_len;
                  queue._M_h._M_buckets = (__buckets_ptr)(local_38->super_IString).str._M_str;
                  pBVar38 = (value_type)
                            MixedArena::allocSpace
                                      (&((pAVar11->super_Builder).wasm)->allocator,0x48,8);
                  *(Id *)&(pBVar38->contents).start.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start = LoadId;
                  *(undefined1 *)
                   &(pBVar38->contents).end.
                    super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = 0;
                  *(char *)&(pBVar38->contents).start.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (char)uVar22;
                  *(undefined1 *)
                   ((long)&(pBVar38->contents).start.
                           super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1) = 1;
                  (pBVar38->contents).end.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)(auStack_70._8_8_ & 0xffffffff);
                  (pBVar38->contents).end.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x4;
                  (pBVar38->contents).actions.
                  super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>.
                  _M_impl.super__Vector_impl_data._M_start = pLVar37;
                  ((Type *)&(pBVar38->contents).start.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish)->id = uVar12;
                  (((Name *)&(pBVar38->contents).actions.
                             super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->super_IString).str._M_len
                       = (size_t)auStack_e8;
                  (pBVar38->contents).actions.
                  super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)queue._M_h._M_buckets
                  ;
                  Load::finalize((Load *)pBVar38);
                  TVar43.id = (uintptr_t)&local_108;
                  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)pBVar38;
                  SmallVector<wasm::Expression_*,_1UL>::push_back
                            ((SmallVector<wasm::Expression_*,_1UL> *)auStack_498,
                             (Expression **)TVar43.id);
                  auStack_70._8_4_ = auStack_70._8_4_ + uVar22;
                  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  parent = (Type *)((long)&(__begin3.
                                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           .parent)->id + 1);
                  pAVar68 = local_40;
                } while ((__begin3.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                          != pTVar35) || (local_a0 != (undefined1  [8])auStack_128));
              }
              pvVar67 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_70._32_8_;
              value = (TupleMake *)loads.usedFixed;
              pFVar59 = local_150;
              if ((Id *)((long)&(((Importable *)auStack_498)->super_Named).name.super_IString.str.
                                _M_len +
                        ((long)loads.flexible.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_start -
                         (long)loads.fixed._M_elems[0] >> 3)) != (Id *)0x1) {
                sVar24 = wasm::Type::size((Type *)auStack_128);
                pFVar59 = local_150;
                if (sVar24 < 2) {
                  handle_unreachable("Unexpected empty type",
                                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp"
                                     ,0x5fb);
                }
                value = Builder::makeTupleMake<wasm::SmallVector<wasm::Expression*,1ul>>
                                  (&((pAVar68->builder)._M_t.
                                     super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                     .
                                     super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                                    ._M_head_impl)->super_Builder,
                                   (SmallVector<wasm::Expression_*,_1UL> *)auStack_498);
              }
              pLVar33 = Builder::makeLocalSet
                                  (&((pAVar68->builder)._M_t.
                                     super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                     .
                                     super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                                    ._M_head_impl)->super_Builder,(Index)pvVar67,(Expression *)value
                                  );
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         local_158,(Expression *)pLVar33);
              pvVar47 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48;
              pAVar54 = local_148;
              if (loads.fixed._M_elems[0] != (Expression *)0x0) {
                operator_delete((void *)loads.fixed._M_elems[0],
                                (long)loads.flexible.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)loads.fixed._M_elems[0]);
                pvVar47 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48;
                pAVar54 = local_148;
              }
            }
          }
          pvVar67 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)((int)pvVar67 + 1)
          ;
        } while (pvVar67 < pvVar47);
      }
      pBVar39 = local_160;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pvVar47;
      Block::finalize(local_160,type_,Unknown);
    }
    uVar61 = 0x28;
    this_03 = (key_type)MixedArena::allocSpace(&((local_178->super_Builder).wasm)->allocator,0x28,8)
    ;
    *(Id *)&(this_03->super_Importable).super_Named.name.super_IString.str._M_len = IfId;
    uVar46 = 0;
    ((Type *)&(this_03->super_Importable).super_Named.name.super_IString.str._M_str)->id = 0;
    *(Store **)&(this_03->super_Importable).super_Named.hasExplicitName = local_168;
    (this_03->super_Importable).module.super_IString.str._M_len = (size_t)pBVar39;
    (this_03->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar61;
    If::finalize((If *)this_03,type__00);
    pAVar11 = (pAVar68->builder)._M_t.
              super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
              _M_head_impl;
    auStack_70._8_8_ = wasm::(anonymous_namespace)::ASYNCIFY_UNWIND;
    auStack_70._16_8_ = DAT_010b1978;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar46;
    auStack_498 = (undefined1  [8])this_03;
    pBVar39 = Builder::makeSequence
                        (&pAVar11->super_Builder,
                         (Expression *)
                         (local_170->_M_t).
                         super___uniq_ptr_impl<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
                         .
                         super__Head_base<0UL,_wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                         ._M_head_impl,(Expression *)local_140,type_00);
    pBVar40 = Builder::makeBlock(&pAVar11->super_Builder,(Expression *)pBVar39);
    (pBVar40->name).super_IString.str._M_len = auStack_70._8_8_;
    (pBVar40->name).super_IString.str._M_str = (char *)auStack_70._16_8_;
    uVar46 = 0;
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pBVar39;
    Block::finalize(pBVar40,type__01,Unknown);
    IVar21 = queue._M_h._M_single_bucket._4_4_;
    loads.usedFixed =
         (size_t)Builder::makeLocalSet
                           (&pAVar11->super_Builder,queue._M_h._M_single_bucket._4_4_,
                            (Expression *)pBVar40);
    pAVar11 = (local_40->builder)._M_t.
              super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
              _M_head_impl;
    auStack_70._8_8_ = AsyncifyBuilder::makeGetStackPos(pAVar11);
    pEVar32 = (Expression *)
              MixedArena::allocSpace
                        (&((((local_40->builder)._M_t.
                             super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                             .
                             super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                            ._M_head_impl)->super_Builder).wasm)->allocator,0x18,8);
    pEVar32->_id = LocalGetId;
    *(Index *)(pEVar32 + 1) = IVar21;
    (pEVar32->type).id = 2;
    auStack_e8 = (undefined1  [8])(local_38->super_IString).str._M_len;
    queue._M_h._M_buckets = (__buckets_ptr)(local_38->super_IString).str._M_str;
    pSVar41 = (Store *)MixedArena::allocSpace(&((pAVar11->super_Builder).wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar41->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar41->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar41->bytes = 0;
    (pSVar41->offset).addr = 0;
    (pSVar41->align).addr = 0;
    *(undefined8 *)&pSVar41->isAtomic = 0;
    (pSVar41->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    pSVar41->bytes = '\x04';
    (pSVar41->align).addr = 4;
    pSVar41->ptr = (Expression *)auStack_70._8_8_;
    pSVar41->value = pEVar32;
    (pSVar41->valueType).id = 2;
    (pSVar41->memory).super_IString.str._M_len = (size_t)auStack_e8;
    (pSVar41->memory).super_IString.str._M_str = (char *)queue._M_h._M_buckets;
    Store::finalize(pSVar41);
    pEVar32 = AsyncifyBuilder::makeIncStackPos
                        ((local_40->builder)._M_t.
                         super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                         .
                         super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                         ._M_head_impl,4);
    pAVar68 = local_40;
    TVar43.id = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar46;
    loads.fixed._M_elems[0] =
         (_Type)Builder::makeSequence(&pAVar11->super_Builder,(Expression *)pSVar41,pEVar32,type_01)
    ;
    auStack_70._8_8_ = 0;
    if ((pAVar68->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      pBVar39 = (Block *)MixedArena::allocSpace
                                   (&((((pAVar68->builder)._M_t.
                                        super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                        .
                                        super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                                       ._M_head_impl)->super_Builder).wasm)->allocator,0x10,8);
      (pBVar39->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = NopId;
      (pBVar39->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      uVar46 = extraout_RDX_01;
    }
    else {
      pFVar59 = (pAVar68->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                .currFunction;
      pSVar41 = (Store *)Function::getNumLocals(pFVar59);
      pMVar53 = &((((pAVar68->builder)._M_t.
                    super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                    .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
                   _M_head_impl)->super_Builder).wasm)->allocator;
      pBVar39 = (Block *)MixedArena::allocSpace(pMVar53,0x40,8);
      (pBVar39->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (pBVar39->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (pBVar39->name).super_IString.str._M_len = 0;
      (pBVar39->name).super_IString.str._M_str = (char *)0x0;
      (pBVar39->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (pBVar39->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (pBVar39->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (pBVar39->list).allocator = pMVar53;
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           (((pAVar68->builder)._M_t.
             super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
            _M_head_impl)->pointerType).id;
      local_140 = pFVar59;
      IVar21 = Builder::addVar((Builder *)pFVar59,(Function *)0x0,(Name)(auVar14 << 0x40),TVar43);
      pAVar11 = (pAVar68->builder)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
                _M_head_impl;
      local_180 = pBVar39;
      pEVar32 = AsyncifyBuilder::makeGetStackPos(pAVar11);
      queue._M_h._M_single_bucket._4_4_ = IVar21;
      pLVar33 = Builder::makeLocalSet(&pAVar11->super_Builder,IVar21,pEVar32);
      local_148 = &(pBVar39->list).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar39->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pLVar33);
      if (pSVar41 != (Store *)0x0) {
        pBVar39 = (Block *)&(pAVar68->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header;
        auStack_70._8_8_ = 0;
        TVar43.id = 0;
        local_168 = pSVar41;
        local_160 = pBVar39;
        do {
          pBVar40 = (Block *)(pAVar68->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_parent;
          pBVar45 = pBVar39;
          pSVar52 = (Store *)TVar43.id;
          if (pBVar40 != (Block *)0x0) {
            do {
              uVar22 = (uint)TVar43.id;
              bVar71 = *(uint *)&(pBVar40->list).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 .data < uVar22;
              if (!bVar71) {
                pBVar45 = pBVar40;
              }
              pBVar40 = (Block *)(&(pBVar40->name).super_IString.str._M_len)[bVar71];
            } while (pBVar40 != (Block *)0x0);
            if ((pBVar45 != pBVar39) &&
               (*(uint *)&(pBVar45->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .data <= uVar22)) {
              local_158 = (Store *)TVar43.id;
              auStack_128 = (undefined1  [8])Function::getLocalType(local_140,uVar22);
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)0x0;
              local_a0 = (undefined1  [8])auStack_128;
              local_150 = (Function *)wasm::Type::size((Type *)auStack_128);
              if (((Function *)
                   __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   parent != local_150) ||
                 (pSVar52 = local_158, pBVar39 = local_160, pSVar41 = local_168,
                 local_a0 != (undefined1  [8])auStack_128)) {
                local_48 = (pointer *)((ulong)local_48 & 0xffffffff00000000);
                do {
                  auStack_70._32_8_ = wasm::Type::Iterator::operator*((Iterator *)local_a0);
                  uVar22 = getByteSize((AsyncifyLocals *)((Type *)auStack_70._32_8_)->id,TVar43);
                  auVar19 = auStack_128;
                  pTVar42 = (TupleExtract *)
                            MixedArena::allocSpace
                                      (&((((pAVar68->builder)._M_t.
                                           super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                           .
                                           super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                                          ._M_head_impl)->super_Builder).wasm)->allocator,0x18,8);
                  (pTVar42->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id
                       = LocalGetId;
                  *(int *)&pTVar42->tuple = (int)local_158;
                  (pTVar42->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.
                  type.id = (uintptr_t)auVar19;
                  sVar24 = wasm::Type::size((Type *)auStack_128);
                  this_04 = pTVar42;
                  if (1 < sVar24) {
                    this_04 = (TupleExtract *)
                              MixedArena::allocSpace
                                        (&((((pAVar68->builder)._M_t.
                                             super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                             .
                                             super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                                            ._M_head_impl)->super_Builder).wasm)->allocator,0x20,8);
                    (this_04->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.
                    _id = TupleExtractId;
                    (this_04->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.
                    type.id = 0;
                    this_04->tuple = (Expression *)pTVar42;
                    this_04->index = (Index)local_48;
                    TupleExtract::finalize(this_04);
                  }
                  if ((uVar22 & 3) != 0) {
                    __assert_fail("size % STACK_ALIGN == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp"
                                  ,0x61a,
                                  "Expression *wasm::(anonymous namespace)::AsyncifyLocals::makeLocalSaving()"
                                 );
                  }
                  pAVar11 = (local_40->builder)._M_t.
                            super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                            .
                            super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                            ._M_head_impl;
                  iVar20 = (int)auStack_70._8_8_;
                  uVar46 = auStack_70._8_8_ & 0xffffffff;
                  local_138 = (type *)(pAVar11->pointerType).id;
                  pEVar32 = (Expression *)
                            MixedArena::allocSpace
                                      (&((pAVar11->super_Builder).wasm)->allocator,0x18,8);
                  pEVar32->_id = LocalGetId;
                  *(Index *)(pEVar32 + 1) = queue._M_h._M_single_bucket._4_4_;
                  (pEVar32->type).id = (uintptr_t)local_138;
                  auStack_70._32_8_ = *(uintptr_t *)auStack_70._32_8_;
                  auStack_e8 = (undefined1  [8])(local_38->super_IString).str._M_len;
                  queue._M_h._M_buckets = (__buckets_ptr)(local_38->super_IString).str._M_str;
                  TVar43.id = (uintptr_t)
                              MixedArena::allocSpace
                                        (&((pAVar11->super_Builder).wasm)->allocator,0x58,8);
                  pAVar68 = local_40;
                  *(undefined8 *)
                   &(((Store *)TVar43.id)->super_SpecificExpression<(wasm::Expression::Id)13>).
                    super_Expression = 0;
                  (((Store *)TVar43.id)->super_SpecificExpression<(wasm::Expression::Id)13>).
                  super_Expression.type.id = 0;
                  *(undefined8 *)&((Store *)TVar43.id)->bytes = 0;
                  (((Store *)TVar43.id)->offset).addr = 0;
                  (((Store *)TVar43.id)->align).addr = 0;
                  *(undefined8 *)&((Store *)TVar43.id)->isAtomic = 0;
                  (((Store *)TVar43.id)->super_SpecificExpression<(wasm::Expression::Id)13>).
                  super_Expression._id = StoreId;
                  ((Store *)TVar43.id)->bytes = (uint8_t)uVar22;
                  (((Store *)TVar43.id)->offset).addr = uVar46;
                  (((Store *)TVar43.id)->align).addr = 4;
                  ((Store *)TVar43.id)->ptr = pEVar32;
                  ((Store *)TVar43.id)->value = (Expression *)this_04;
                  (((Store *)TVar43.id)->valueType).id = auStack_70._32_8_;
                  (((Store *)TVar43.id)->memory).super_IString.str._M_len = (size_t)auStack_e8;
                  (((Store *)TVar43.id)->memory).super_IString.str._M_str =
                       (char *)queue._M_h._M_buckets;
                  Store::finalize((Store *)TVar43.id);
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                            (local_148,(Expression *)TVar43.id);
                  auStack_70._8_8_ = ZEXT48(iVar20 + uVar22);
                  local_48 = (pointer *)CONCAT44(local_48._4_4_,(Index)local_48 + 1);
                  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  parent = (Type *)((long)&(__begin3.
                                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           .parent)->id + 1);
                } while (((Function *)
                          __begin3.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                          != local_150) ||
                        (pSVar52 = local_158, pBVar39 = local_160, pSVar41 = local_168,
                        local_a0 != (undefined1  [8])auStack_128));
              }
            }
          }
          TVar43.id = (uintptr_t)((int)pSVar52 + 1);
        } while (TVar43.id < pSVar41);
      }
      pEVar32 = AsyncifyBuilder::makeIncStackPos
                          ((pAVar68->builder)._M_t.
                           super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                           .
                           super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                           ._M_head_impl,(int32_t)auStack_70._8_8_);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (local_148,pEVar32);
      pBVar39 = local_180;
      type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar32;
      Block::finalize(local_180,type__02,Unknown);
      uVar46 = extraout_RDX_00;
    }
    auStack_e8 = (undefined1  [8])auStack_498;
    queue._M_h._M_buckets = (__buckets_ptr)0x4;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar46;
    loads.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pBVar39;
    this_05 = (BasicBlock *)
              Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                        (&local_178->super_Builder,
                         (initializer_list<wasm::Expression_*> *)auStack_e8,type);
    puVar1 = local_188;
    SVar72 = HeapType::getSignature((HeapType *)local_188);
    if (SVar72.results.id.id != 0) {
      SVar72 = HeapType::getSignature((HeapType *)puVar1);
      pEVar32 = LiteralUtils::makeZero
                          (SVar72.results.id,
                           (pAVar68->
                           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                           ).
                           super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                           .currModule);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 ((long)&(this_05->contents).end + 8),pEVar32);
      SVar72 = HeapType::getSignature((HeapType *)puVar1);
      type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)SVar72.results.id;
      Block::finalize((Block *)this_05,type__03,Unknown);
    }
    iVar18._M_current = __end0._M_current;
    __end0._M_current[0xc]._M_t.
    super___uniq_ptr_impl<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
    .
    super__Head_base<0UL,_wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_false>
    ._M_head_impl = this_05;
    ReFinalize::ReFinalize((ReFinalize *)auStack_498);
    uStack_370 = (pAVar68->
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                 ).
                 super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                 .currModule;
    local_378 = (Function *)iVar18._M_current;
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
              ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
               local_440,(Expression **)local_170);
    local_378 = (Function *)0x0;
    uStack_370 = (Module *)0x0;
    auStack_498 = (undefined1  [8])&PTR__ReFinalize_01070c30;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_368);
    if (pTStack_390 != (pointer)0x0) {
      operator_delete(pTStack_390,(long)local_380 - (long)pTStack_390);
    }
    Pass::~Pass((Pass *)auStack_498);
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // If the function cannot change our state, we have nothing to do -
    // we will never unwind or rewind the stack here.
    if (!analyzer->needsInstrumentation(func)) {
      return;
    }
    // Find the locals that we actually need to load and save: any local that is
    // alive at a relevant call site must be handled, but others can be ignored.
    findRelevantLiveLocals(func);
    // The new function body has a prelude to load locals if rewinding,
    // then the actual main body, which does all its unwindings by breaking
    // to the unwind block, which then handles pushing the call index, as
    // well as saving the locals.
    // An index is needed for getting the unwinding and rewinding call indexes
    // around TODO: can this be the same index?
    auto unwindIndex = builder->addVar(func, Type::i32);
    rewindIndex = builder->addVar(func, Type::i32);
    // Rewrite the function body.
    builder = std::make_unique<AsyncifyBuilder>(
      *getModule(), pointerType, asyncifyMemory);
    walk(func->body);
    // After the normal function body, emit a barrier before the postamble.
    Expression* barrier;
    if (func->getResults() == Type::none) {
      // The function may have ended without a return; ensure one.
      barrier = builder->makeReturn();
    } else {
      // The function must have returned or hit an unreachable, but emit one
      // to make possible bugs easier to figure out (as this should never be
      // reached). The optimizer can remove this anyhow.
      barrier = builder->makeUnreachable();
    }
    auto* newBody = builder->makeBlock(
      {builder->makeIf(builder->makeStateCheck(State::Rewinding),
                       makeLocalLoading()),
       builder->makeLocalSet(
         unwindIndex,
         builder->makeBlock(ASYNCIFY_UNWIND,
                            builder->makeSequence(func->body, barrier))),
       makeCallIndexPush(unwindIndex),
       makeLocalSaving()});
    if (func->getResults() != Type::none) {
      // If we unwind, we must still "return" a value, even if it will be
      // ignored on the outside.
      newBody->list.push_back(
        LiteralUtils::makeZero(func->getResults(), *getModule()));
      newBody->finalize(func->getResults());
    }
    func->body = newBody;
    // Making things like returns conditional may alter types.
    ReFinalize().walkFunctionInModule(func, getModule());
  }